

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDual.c
# Opt level: O0

void Saig_ObjDualFanin(Aig_Man_t *pAigNew,Vec_Ptr_t *vCopies,Aig_Obj_t *pObj,int iFanin,
                      Aig_Obj_t **ppRes0,Aig_Obj_t **ppRes1)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  int local_54;
  int fCompl;
  Aig_Obj_t *pCare;
  Aig_Obj_t *pTemp1;
  Aig_Obj_t *pTemp0;
  Aig_Obj_t **ppRes1_local;
  Aig_Obj_t **ppRes0_local;
  int iFanin_local;
  Aig_Obj_t *pObj_local;
  Vec_Ptr_t *vCopies_local;
  Aig_Man_t *pAigNew_local;
  
  if ((iFanin != 0) && (iFanin != 1)) {
    __assert_fail("iFanin == 0 || iFanin == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigDual.c"
                  ,0x25,
                  "void Saig_ObjDualFanin(Aig_Man_t *, Vec_Ptr_t *, Aig_Obj_t *, int, Aig_Obj_t **, Aig_Obj_t **)"
                 );
  }
  if (iFanin == 0) {
    iVar1 = Aig_ObjFaninId0(pObj);
    pTemp1 = Saig_ObjDual(vCopies,iVar1,0);
    iVar1 = Aig_ObjFaninId0(pObj);
    pCare = Saig_ObjDual(vCopies,iVar1,1);
    local_54 = Aig_ObjFaninC0(pObj);
  }
  else {
    iVar1 = Aig_ObjFaninId1(pObj);
    pTemp1 = Saig_ObjDual(vCopies,iVar1,0);
    iVar1 = Aig_ObjFaninId1(pObj);
    pCare = Saig_ObjDual(vCopies,iVar1,1);
    local_54 = Aig_ObjFaninC1(pObj);
  }
  if (local_54 == 0) {
    *ppRes0 = pTemp1;
    *ppRes1 = pCare;
  }
  else {
    pAVar2 = Aig_Or(pAigNew,pTemp1,pCare);
    pAVar3 = Aig_And(pAigNew,pCare,pAVar2);
    *ppRes0 = pAVar3;
    pAVar2 = Aig_And(pAigNew,pTemp1,pAVar2);
    *ppRes1 = pAVar2;
  }
  return;
}

Assistant:

static inline void        Saig_ObjDualFanin( Aig_Man_t * pAigNew, Vec_Ptr_t * vCopies, Aig_Obj_t * pObj, int iFanin, Aig_Obj_t ** ppRes0, Aig_Obj_t ** ppRes1 ) {

    Aig_Obj_t * pTemp0, * pTemp1, * pCare;
    int fCompl;
    assert( iFanin == 0 || iFanin == 1 );
    if ( iFanin == 0 )
    {
        pTemp0 = Saig_ObjDual( vCopies, Aig_ObjFaninId0(pObj), 0 );
        pTemp1 = Saig_ObjDual( vCopies, Aig_ObjFaninId0(pObj), 1 );
        fCompl = Aig_ObjFaninC0( pObj );
    }
    else
    {
        pTemp0 = Saig_ObjDual( vCopies, Aig_ObjFaninId1(pObj), 0 );
        pTemp1 = Saig_ObjDual( vCopies, Aig_ObjFaninId1(pObj), 1 );
        fCompl = Aig_ObjFaninC1( pObj );
    }
    if ( fCompl )
    {
        pCare   = Aig_Or( pAigNew, pTemp0, pTemp1 );
        *ppRes0 = Aig_And( pAigNew, pTemp1, pCare );
        *ppRes1 = Aig_And( pAigNew, pTemp0, pCare );
    }
    else
    {
        *ppRes0 = pTemp0;
        *ppRes1 = pTemp1;
    }
}